

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Cart_shift(MPIABI_Comm comm,int direction,int disp,int *rank_source,int *rank_dest)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  WPI_Handle<ompi_communicator_t_*> local_30;
  int *local_28;
  int *rank_dest_local;
  int *rank_source_local;
  int disp_local;
  int direction_local;
  MPIABI_Comm comm_local;
  
  local_28 = rank_dest;
  rank_dest_local = rank_source;
  rank_source_local._0_4_ = disp;
  rank_source_local._4_4_ = direction;
  _disp_local = comm;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_30,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_30);
  iVar1 = MPI_Cart_shift(poVar2,rank_source_local._4_4_,(int)rank_source_local,rank_dest_local,
                         local_28);
  return iVar1;
}

Assistant:

int MPIABI_Cart_shift(
  MPIABI_Comm comm,
  int direction,
  int disp,
  int * rank_source,
  int * rank_dest
) {
  return MPI_Cart_shift(
    (MPI_Comm)(WPI_Comm)comm,
    direction,
    disp,
    rank_source,
    rank_dest
  );
}